

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNative.cpp
# Opt level: O2

void chatra::emb::io::parsePositionArgs
               (Ct *ct,size_t offsetIndex,size_t lengthIndex,ptrdiff_t bufferSize,ptrdiff_t *offset,
               ptrdiff_t *length)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 uVar2;
  undefined4 extraout_var_00;
  long lVar3;
  undefined8 *puVar4;
  long lVar5;
  
  iVar1 = (*ct->_vptr_NativeCallContext[10])(ct,1);
  uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))
                    ((long *)CONCAT44(extraout_var,iVar1));
  *(undefined8 *)lengthIndex = uVar2;
  iVar1 = (*ct->_vptr_NativeCallContext[10])(ct,2);
  lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x58))
                    ((long *)CONCAT44(extraout_var_00,iVar1));
  *(long *)bufferSize = lVar3;
  lVar5 = *(long *)lengthIndex;
  if (lVar5 < 0) {
    lVar5 = lVar5 + offsetIndex;
    *(long *)lengthIndex = lVar5;
    if (lVar5 < 0) goto LAB_001aef4a;
    lVar3 = *(long *)bufferSize;
  }
  if (lVar3 < 0) {
    lVar3 = offsetIndex - lVar5;
    *(long *)bufferSize = lVar3;
    if (lVar3 < 0) goto LAB_001aef4a;
  }
  if (lVar3 + *(long *)lengthIndex <= (long)offsetIndex) {
    return;
  }
LAB_001aef4a:
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
  puVar4[2] = 0;
  puVar4[3] = 0;
  puVar4[4] = 0;
  puVar4[1] = puVar4 + 3;
  *(undefined1 *)(puVar4 + 3) = 0;
  *puVar4 = &PTR__NativeException_0023ce78;
  __cxa_throw(puVar4,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
}

Assistant:

static void parsePositionArgs(Ct& ct, size_t offsetIndex, size_t lengthIndex, ptrdiff_t bufferSize,
		ptrdiff_t& offset, ptrdiff_t& length) {

	offset = ct.at(offsetIndex).get<ptrdiff_t>();
	length = ct.at(lengthIndex).get<ptrdiff_t>();

	if (offset < 0)
		offset = bufferSize + offset;
	if (offset < 0)
		throw IllegalArgumentException();
	if (length < 0)
		length = bufferSize - offset;
	if (length < 0 || offset + length > bufferSize)
		throw IllegalArgumentException();
}